

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O3

void __thiscall
irr::io::CZipReader::CZipReader
          (CZipReader *this,IFileSystem *fs,IReadFile *file,bool ignoreCase,bool ignorePaths,
          bool isGZip)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  string<char> local_50;
  
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined4 *)&this->field_0x78 = 1;
  *(undefined8 *)&this->field_0x40 = 0x26a8b0;
  *(undefined8 *)&this->field_0x68 = 0x26a908;
  *(undefined1 **)&this->field_0x48 = &this->field_0x58;
  *(undefined8 *)&this->field_0x50 = 0;
  this->field_0x58 = 0;
  if (file == (IReadFile *)0x0) {
    local_50.str._M_dataplus._M_p = (pointer)&local_50.str.field_2;
    local_50.str._M_string_length = 0;
    local_50.str.field_2._M_local_buf[0] = '\0';
    core::string<char>::operator=(&local_50,"");
  }
  else {
    iVar2 = (*file->_vptr_IReadFile[4])(file);
    local_50.str._M_dataplus._M_p = (pointer)&local_50.str.field_2;
    local_50.str._M_string_length = 0;
    local_50.str.field_2._M_local_buf[0] = '\0';
    if (&local_50 != (string<char> *)CONCAT44(extraout_var,iVar2)) {
      ::std::__cxx11::string::_M_assign((string *)&local_50);
    }
  }
  CFileList::CFileList
            ((CFileList *)&this->field_0x80,&PTR_construction_vtable_120__0026a7b0,&local_50,
             ignoreCase,ignorePaths);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
    operator_delete(local_50.str._M_dataplus._M_p,
                    CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                             local_50.str.field_2._M_local_buf[0]) + 1);
  }
  this->_vptr_CZipReader = (_func_int **)&PTR__CZipReader_0026a5b0;
  *(undefined ***)&this->field_0x40 = &PTR_createAndOpenFile_0026a638;
  *(undefined ***)&this->field_0x68 = &PTR__CZipReader_0026a690;
  *(undefined ***)&this->field_0x80 = &PTR_getFileCount_0026a718;
  this->FileSystem = fs;
  this->File = file;
  (this->FileInfo).m_data.
  super__Vector_base<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FileInfo).m_data.
  super__Vector_base<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FileInfo).m_data.
  super__Vector_base<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FileInfo).is_sorted = true;
  this->IsGZip = isGZip;
  if (file != (IReadFile *)0x0) {
    *(int *)(&file->field_0x10 + (long)file->_vptr_IReadFile[-3]) =
         *(int *)(&file->field_0x10 + (long)file->_vptr_IReadFile[-3]) + 1;
    if (isGZip) {
      scanGZipHeader(this);
    }
    else {
      do {
        bVar1 = scanZipHeader(this,false);
      } while (bVar1);
    }
    (**(code **)(*(long *)((long)&this->_vptr_CZipReader + (long)this->_vptr_CZipReader[-5]) + 0x50)
    )((_func_int *)((long)&this->_vptr_CZipReader + (long)this->_vptr_CZipReader[-5]));
  }
  return;
}

Assistant:

CZipReader::CZipReader(IFileSystem *fs, IReadFile *file, bool ignoreCase, bool ignorePaths, bool isGZip) :
		CFileList((file ? file->getFileName() : io::path("")), ignoreCase, ignorePaths), FileSystem(fs), File(file), IsGZip(isGZip)
{
#ifdef _DEBUG
	setDebugName("CZipReader");
#endif

	if (File) {
		File->grab();

		// load file entries
		if (IsGZip)
			while (scanGZipHeader()) {
			}
		else
			while (scanZipHeader()) {
			}

		sort();
	}
}